

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::pragma_source_text_group(CTcTokenizer *this)

{
  utf8_ptr *p;
  CTcToken *tok;
  size_t sVar1;
  short *psVar2;
  tc_toktyp_t tVar3;
  int f;
  
  if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x4) !=
      (undefined1  [3440])0x0) {
    return;
  }
  p = &this->p_;
  tok = &this->curtok_;
  tVar3 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
  if (tVar3 == TOKT_EOF) {
    f = 1;
LAB_0022011d:
    CTcParser::set_source_text_group_mode(G_prs,f);
  }
  else {
    if ((tVar3 == TOKT_LPAR) &&
       (tVar3 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0), tVar3 == TOKT_SYM)) {
      sVar1 = (this->curtok_).text_len_;
      if (sVar1 == 3) {
        psVar2 = (short *)(this->curtok_).text_;
        if ((char)psVar2[1] == 'f' && *psVar2 == 0x666f) {
          f = 0;
          goto LAB_0022014e;
        }
      }
      else if ((sVar1 == 2) && (*(short *)(this->curtok_).text_ == 0x6e6f)) {
        f = 1;
LAB_0022014e:
        tVar3 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
        if (tVar3 == TOKT_RPAR) goto LAB_0022011d;
      }
    }
    log_warning(0x271f);
  }
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  return;
}

Assistant:

void CTcTokenizer::pragma_source_text_group()
{
    tc_toktyp_t tok;
    int f;

    /* if we're in preprocess-only mode, just pass the pragma through */
    if (pp_only_mode_)
        return;

    /* get the '(' token and the on/off token, if present */
    if ((tok = next_on_line()) == TOKT_EOF)
    {
        /* no on/off - by default it's on */
        f = TRUE;
    }
    else if (tok == TOKT_LPAR && next_on_line() == TOKT_SYM)
    {
        /* get the on/off mode */
        if (curtok_.get_text_len() == 2
            && memcmp(curtok_.get_text(), "on", 2) == 0)
        {
            /* it's 'on' */
            f = TRUE;
        }
        else if (curtok_.get_text_len() == 3
                 && memcmp(curtok_.get_text(), "off", 3) == 0)
        {
            /* it's 'off' */
            f = FALSE;
        }
        else
        {
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);
            goto done;
        }

        /* make sure we have the ')' token */
        if (next_on_line() != TOKT_RPAR)
        {
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);
            goto done;
        }
    }
    else
    {
        /* anything else is invalid syntax */
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* set the new mode in the parser */
    G_prs->set_source_text_group_mode(f);

done:
    /* done - discard this line buffer */
    clear_linebuf();
}